

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

double phyr::averageSampleRange(double *lambda,double *v,int n,double lambda0,double lambda1)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  int in_EDX;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  double dVar6;
  double in_XMM1_Qa;
  double v1;
  double v0;
  double invLambdaRange;
  double seg1;
  double seg0;
  int i;
  double vsum;
  int local_3c;
  double local_38;
  double local_30;
  double local_28;
  int local_1c;
  double *local_18;
  double *local_10;
  double local_8;
  
  if ((in_XMM1_Qa <= *in_RDI) || (in_EDX == 1)) {
    local_8 = *in_RSI;
  }
  else if (in_XMM0_Qa < in_RDI[in_EDX + -1]) {
    local_38 = 0.0;
    if (in_XMM0_Qa < *in_RDI) {
      local_38 = *in_RSI * (*in_RDI - in_XMM0_Qa) + 0.0;
    }
    if (in_RDI[in_EDX + -1] <= in_XMM1_Qa && in_XMM1_Qa != in_RDI[in_EDX + -1]) {
      local_38 = in_RSI[in_EDX + -1] * (in_XMM1_Qa - in_RDI[in_EDX + -1]) + local_38;
    }
    local_3c = 0;
    while (local_30 = in_XMM1_Qa, local_28 = in_XMM0_Qa, local_1c = in_EDX, local_18 = in_RSI,
          local_10 = in_RDI, in_RDI[local_3c + 1] < in_XMM0_Qa) {
      local_3c = local_3c + 1;
    }
    while( true ) {
      bVar3 = false;
      if (local_3c < local_1c + -1) {
        bVar3 = local_10[local_3c] < local_30;
      }
      if (!bVar3) break;
      pdVar4 = std::max<double>(&local_28,local_10 + local_3c);
      dVar1 = *pdVar4;
      pdVar4 = std::min<double>(&local_30,local_10 + (local_3c + 1));
      dVar2 = *pdVar4;
      dVar5 = 1.0 / (local_10[local_3c + 1] - local_10[local_3c]);
      dVar6 = lerp((dVar1 - local_10[local_3c]) * dVar5,local_18[local_3c],local_18[local_3c + 1]);
      dVar5 = lerp((dVar2 - local_10[local_3c]) * dVar5,local_18[local_3c],local_18[local_3c + 1]);
      local_38 = (dVar2 - dVar1) * 0.5 * (dVar6 + dVar5) + local_38;
      local_3c = local_3c + 1;
    }
    local_8 = local_38 / (local_30 - local_28);
  }
  else {
    local_8 = in_RSI[in_EDX + -1];
  }
  return local_8;
}

Assistant:

Real averageSampleRange(const Real* lambda, const Real* v, int n,
                        Real lambda0, Real lambda1) {
    // Check for edge cases
    if (lambda1 <= lambda[0] || n == 1) return v[0];
    if (lambda0 >= lambda[n-1]) return v[n-1];

    // Check for cases of range partial overlap

    // {vsum} stores area under the curve of the overlapped region
    Real vsum = 0;
    if (lambda0 < lambda[0])
        vsum += v[0] * (lambda[0] - lambda0);
    if (lambda1 > lambda[n-1])
        vsum += v[n-1] * (lambda1 - lambda[n-1]);

    // Find first overlapping wavelength segment
    int i = 0;
    while (lambda[i+1] < lambda0) i++;

    // Iterate over overlapping segments
    for (; i < n - 1 && lambda[i] < lambda1; i++) {
        // Compute segment limits
        Real seg0 = std::max(lambda0, lambda[i]);
        Real seg1 = std::min(lambda1, lambda[i+1]);

        // Interpolated values
        Real invLambdaRange = 1.0 / (lambda[i+1] - lambda[i]);
        Real v0 = lerp((seg0 - lambda[i]) * invLambdaRange, v[i], v[i+1]);
        Real v1 = lerp((seg1 - lambda[i]) * invLambdaRange, v[i], v[i+1]);

        // Add the calculated area
        vsum += 0.5 * (seg1 - seg0) * (v0 + v1);
    }

    // Return average value
    return vsum / (lambda1 - lambda0);
}